

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall libcellml::Importer::addModel(Importer *this,ModelPtr *model,string *key)

{
  LoggerImpl *pLVar1;
  size_type sVar2;
  string normalisedKey;
  string sStack_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
  local_48;
  
  normaliseDirectorySeparator(&sStack_68,key);
  pLVar1 = Logger::pFunc(&this->super_Logger);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
                   *)&pLVar1[1].mErrors.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&sStack_68);
  if (sVar2 == 0) {
    pLVar1 = Logger::pFunc(&this->super_Logger);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_48,&sStack_68,model);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::Model>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
                *)&pLVar1[1].mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::~pair(&local_48);
  }
  std::__cxx11::string::~string((string *)&sStack_68);
  return sVar2 == 0;
}

Assistant:

bool Importer::addModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        // If the key already exists in the library, do nothing.
        return false;
    }
    pFunc()->mLibrary.insert(std::make_pair(normalisedKey, model));
    return true;
}